

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

int __thiscall re2::Compiler::AllocInst(Compiler *this,int n)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  Inst *__dest;
  Inst *local_58;
  int id;
  Inst *ip;
  int n_local;
  Compiler *this_local;
  
  if (((this->failed_ & 1U) == 0) && (this->inst_len_ + n <= this->max_inst_)) {
    if (this->inst_cap_ < this->inst_len_ + n) {
      if (this->inst_cap_ == 0) {
        this->inst_cap_ = 8;
      }
      while (this->inst_cap_ < this->inst_len_ + n) {
        this->inst_cap_ = this->inst_cap_ << 1;
      }
      uVar2 = (ulong)this->inst_cap_;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar2;
      uVar3 = SUB168(auVar1 * ZEXT816(8),0);
      if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
        uVar3 = 0xffffffffffffffff;
      }
      __dest = (Inst *)operator_new__(uVar3);
      if (uVar2 != 0) {
        local_58 = __dest;
        do {
          Prog::Inst::Inst(local_58);
          local_58 = local_58 + 1;
        } while (local_58 != __dest + uVar2);
      }
      memmove(__dest,this->inst_,(long)this->inst_len_ << 3);
      memset(__dest + this->inst_len_,0,(long)(this->inst_cap_ - this->inst_len_) << 3);
      if (this->inst_ != (Inst *)0x0) {
        operator_delete__(this->inst_);
      }
      this->inst_ = __dest;
    }
    this_local._4_4_ = this->inst_len_;
    this->inst_len_ = n + this->inst_len_;
  }
  else {
    this->failed_ = true;
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int Compiler::AllocInst(int n) {
  if (failed_ || inst_len_ + n > max_inst_) {
    failed_ = true;
    return -1;
  }

  if (inst_len_ + n > inst_cap_) {
    if (inst_cap_ == 0)
      inst_cap_ = 8;
    while (inst_len_ + n > inst_cap_)
      inst_cap_ *= 2;
    Prog::Inst* ip = new Prog::Inst[inst_cap_];
    memmove(ip, inst_, inst_len_ * sizeof ip[0]);
    memset(ip + inst_len_, 0, (inst_cap_ - inst_len_) * sizeof ip[0]);
    delete[] inst_;
    inst_ = ip;
  }
  int id = inst_len_;
  inst_len_ += n;
  return id;
}